

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

int Gia_Sim2ClassRefineOne(Gia_Sim2_t *p,int i)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  uint *p0;
  Gia_Obj_t *pObj_00;
  uint *p1;
  int local_44;
  int Ent;
  uint *pSim1;
  uint *pSim0;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  int i_local;
  Gia_Sim2_t *p_local;
  
  Vec_IntClear(p->vClassOld);
  Vec_IntClear(p->vClassNew);
  Vec_IntPush(p->vClassOld,i);
  pObj = Gia_ManObj(p->pAig,i);
  p0 = Gia_Sim2Data(p,i);
  iVar1 = Gia_ObjIsHead(p->pAig,i);
  if (iVar1 != 0) {
    for (local_44 = Gia_ObjNext(p->pAig,i); 0 < local_44; local_44 = Gia_ObjNext(p->pAig,local_44))
    {
      pObj_00 = Gia_ManObj(p->pAig,local_44);
      p1 = Gia_Sim2Data(p,local_44);
      iVar1 = p->nWords;
      uVar2 = Gia_ObjPhase(pObj);
      uVar3 = Gia_ObjPhase(pObj_00);
      iVar1 = Gia_Sim2CompareEqual(p0,p1,iVar1,uVar2 ^ uVar3);
      if (iVar1 == 0) {
        Vec_IntPush(p->vClassNew,local_44);
      }
      else {
        Vec_IntPush(p->vClassOld,local_44);
      }
    }
    iVar1 = Vec_IntSize(p->vClassNew);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      Gia_Sim2ClassCreate(p->pAig,p->vClassOld);
      Gia_Sim2ClassCreate(p->pAig,p->vClassNew);
      iVar1 = Vec_IntSize(p->vClassNew);
      if (iVar1 < 2) {
        p_local._4_4_ = 1;
      }
      else {
        iVar1 = Vec_IntEntry(p->vClassNew,0);
        iVar1 = Gia_Sim2ClassRefineOne(p,iVar1);
        p_local._4_4_ = iVar1 + 1;
      }
    }
    return p_local._4_4_;
  }
  __assert_fail("Gia_ObjIsHead(p->pAig, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim2.c"
                ,0x19b,"int Gia_Sim2ClassRefineOne(Gia_Sim2_t *, int)");
}

Assistant:

int Gia_Sim2ClassRefineOne( Gia_Sim2_t * p, int i )
{
    Gia_Obj_t * pObj0, * pObj1;
    unsigned * pSim0, * pSim1;
    int Ent;
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pObj0 = Gia_ManObj( p->pAig, i );
    pSim0 = Gia_Sim2Data( p, i );
    Gia_ClassForEachObj1( p->pAig, i, Ent )
    {
        pObj1 = Gia_ManObj( p->pAig, Ent );
        pSim1 = Gia_Sim2Data( p, Ent );
        if ( Gia_Sim2CompareEqual( pSim0, pSim1, p->nWords, Gia_ObjPhase(pObj0) ^ Gia_ObjPhase(pObj1) ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
            Vec_IntPush( p->vClassNew, Ent );
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Gia_Sim2ClassCreate( p->pAig, p->vClassOld );
    Gia_Sim2ClassCreate( p->pAig, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Gia_Sim2ClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}